

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O2

void __thiscall wirehair::Codec::SetDeferredColumns(Codec *this)

{
  ulong *puVar1;
  ushort uVar2;
  ushort uVar3;
  uint16_t uVar4;
  uint uVar5;
  PeelRefs *pPVar6;
  PeelColumn *pPVar7;
  uint64_t *puVar8;
  uint16_t *puVar9;
  ulong uVar10;
  uint16_t uVar11;
  ulong uVar12;
  ulong uVar13;
  PeelColumn *pPVar14;
  ulong uVar15;
  
  pPVar14 = (PeelColumn *)&this->_defer_head_columns;
  uVar12 = 0;
  while( true ) {
    uVar2 = pPVar14->Next;
    uVar10 = (ulong)uVar2;
    if (uVar10 == 0xffff) break;
    pPVar6 = this->_peel_col_refs;
    uVar13 = uVar12 & 0xffff;
    pPVar7 = this->_peel_cols;
    puVar8 = this->_compress_matrix;
    uVar3 = pPVar6[uVar10].RowCount;
    uVar5 = this->_ge_pitch;
    for (uVar15 = 0; uVar3 != uVar15; uVar15 = uVar15 + 1) {
      puVar1 = (ulong *)((long)puVar8 +
                        (ulong)(pPVar6[uVar10].Rows[uVar15] * uVar5) * 8 +
                        (ulong)(uint)((int)(uVar13 >> 6) << 3));
      *puVar1 = *puVar1 | 1L << (uVar12 & 0x3f);
    }
    pPVar14 = pPVar7 + uVar10;
    this->_ge_col_map[uVar13] = uVar2;
    pPVar7[uVar10].field_1.Weight2Refs = (uint16_t)uVar12;
    uVar12 = (ulong)((int)uVar13 + 1);
  }
  uVar4 = this->_mix_count;
  puVar9 = this->_ge_col_map;
  for (uVar11 = 0; uVar4 != uVar11; uVar11 = uVar11 + 1) {
    puVar9[(ushort)(this->_defer_count + uVar11)] = uVar11 + this->_block_count;
  }
  return;
}

Assistant:

void Codec::SetDeferredColumns()
{
    CAT_IF_DUMP(cout << endl << "---- SetDeferredColumns ----" << endl << endl;)

    PeelColumn * GF256_RESTRICT column;

    // For each deferred column:
    for (uint16_t ge_column_i = 0, defer_i = _defer_head_columns;
        defer_i != LIST_TERM;
        defer_i = column->Next, ++ge_column_i)
    {
        column = &_peel_cols[defer_i];

        CAT_IF_DUMP(cout << "GE column " << ge_column_i <<
            " mapped to matrix column " << defer_i << " :";)

        // Get pointer to this matrix row
        uint64_t *matrix_row_offset = _compress_matrix + (ge_column_i >> 6);

        // Get word mask for this column bit
        const uint64_t ge_mask = (uint64_t)1 << (ge_column_i & 63);

        // Get references for this deferred index
        const PeelRefs * GF256_RESTRICT refs = &_peel_col_refs[defer_i];

        // For each affected row:
        for (unsigned i = 0, count = refs->RowCount; i < count; ++i)
        {
            const uint16_t row_i = refs->Rows[i];

            CAT_IF_DUMP(cout << " " << row_i;)

            matrix_row_offset[_ge_pitch * row_i] |= ge_mask;
        }

        CAT_IF_DUMP(cout << endl;)

        // Set column map for this GE column
        _ge_col_map[ge_column_i] = defer_i;

        // Set reverse mapping also
        column->GEColumn = ge_column_i;
    }

    // Set column map for each mix column:
    for (uint16_t added_i = 0, count = _mix_count; added_i < count; ++added_i)
    {
        CAT_DEBUG_ASSERT((unsigned)_defer_count + (unsigned)added_i < 65536);
        CAT_DEBUG_ASSERT((unsigned)_block_count + (unsigned)added_i < 65536);
        const uint16_t ge_column_i = _defer_count + added_i;
        const uint16_t column_i = _block_count + added_i;

        CAT_IF_DUMP(cout << "GE column(mix) " << ge_column_i <<
            " mapped to matrix column " << column_i << endl;)

        _ge_col_map[ge_column_i] = column_i;
    }
}